

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_sampler
          (StateRecorder *this,VkSampler sampler,VkSamplerCreateInfo *create_info,Hash custom_hash)

{
  bool bVar1;
  int iVar2;
  mutex *__mutex;
  VkSamplerCreateInfo *new_info;
  VkSamplerCreateInfo *local_58;
  WorkItem local_50;
  
  __mutex = &this->impl->record_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_58 = (VkSamplerCreateInfo *)0x0;
    bVar1 = Impl::copy_sampler(this->impl,create_info,&this->impl->temp_allocator,&local_58);
    if (bVar1) {
      local_50.type = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
      local_50.create_info = local_58;
      local_50.handle = (uint64_t)sampler;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      Impl::pump_synchronized_recording(this->impl,this);
    }
    else {
      Impl::push_unregister_locked<VkSampler_T*>
                (this->impl,VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,sampler);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    return bVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool StateRecorder::record_sampler(VkSampler sampler, const VkSamplerCreateInfo &create_info, Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkSamplerCreateInfo *new_info = nullptr;
		if (!impl->copy_sampler(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO, sampler);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO, api_object_cast<uint64_t>(sampler),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}